

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

unsigned_long_long __thiscall FatSystem::clusterAddress(FatSystem *this,uint cluster,bool isRoot)

{
  unsigned_long_long local_20;
  unsigned_long_long addr;
  bool isRoot_local;
  uint cluster_local;
  FatSystem *this_local;
  
  if ((this->type == 0) || (addr._4_4_ = cluster, !isRoot)) {
    addr._4_4_ = cluster - 2;
  }
  local_20 = this->dataStart + this->bytesPerSector * this->sectorsPerCluster * (ulong)addr._4_4_;
  if ((this->type == 1) && (!isRoot)) {
    local_20 = this->rootEntries * 0x20 + local_20;
  }
  return local_20;
}

Assistant:

unsigned long long FatSystem::clusterAddress(unsigned int cluster, bool isRoot)
{
    if (type == FAT32 || !isRoot) {
        cluster -= 2;
    }

    unsigned long long addr = (dataStart + bytesPerSector*sectorsPerCluster*cluster);

    if (type == FAT16 && !isRoot) {
        addr += rootEntries * FAT_ENTRY_SIZE;
    }

    return addr;
}